

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

void __thiscall
Pool::RetrieveReadyEdges
          (Pool *this,set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *ready_queue)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference ppEVar4;
  iterator __first;
  Edge *local_30;
  Edge *edge;
  _Self local_20;
  iterator it;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *ready_queue_local;
  Pool *this_local;
  
  it._M_node = (_Base_ptr)ready_queue;
  local_20._M_node =
       (_Base_ptr)
       std::set<Edge_*,_bool_(*)(const_Edge_*,_const_Edge_*),_std::allocator<Edge_*>_>::begin
                 (&this->delayed_);
  while( true ) {
    edge = (Edge *)std::set<Edge_*,_bool_(*)(const_Edge_*,_const_Edge_*),_std::allocator<Edge_*>_>::
                   end(&this->delayed_);
    bVar2 = std::operator!=(&local_20,(_Self *)&edge);
    if (!bVar2) break;
    ppEVar4 = std::_Rb_tree_const_iterator<Edge_*>::operator*(&local_20);
    local_30 = *ppEVar4;
    iVar1 = this->current_use_;
    iVar3 = Edge::weight(local_30);
    if (this->depth_ < iVar1 + iVar3) break;
    std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::insert
              ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)it._M_node,&local_30);
    EdgeScheduled(this,local_30);
    std::_Rb_tree_const_iterator<Edge_*>::operator++(&local_20);
  }
  __first = std::set<Edge_*,_bool_(*)(const_Edge_*,_const_Edge_*),_std::allocator<Edge_*>_>::begin
                      (&this->delayed_);
  std::set<Edge*,bool(*)(Edge_const*,Edge_const*),std::allocator<Edge*>>::erase_abi_cxx11_
            ((set<Edge*,bool(*)(Edge_const*,Edge_const*),std::allocator<Edge*>> *)&this->delayed_,
             (const_iterator)__first._M_node,(const_iterator)local_20._M_node);
  return;
}

Assistant:

void Pool::RetrieveReadyEdges(set<Edge*>* ready_queue) {
  DelayedEdges::iterator it = delayed_.begin();
  while (it != delayed_.end()) {
    Edge* edge = *it;
    if (current_use_ + edge->weight() > depth_)
      break;
    ready_queue->insert(edge);
    EdgeScheduled(*edge);
    ++it;
  }
  delayed_.erase(delayed_.begin(), it);
}